

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

int wally_addr_segwit_to_bytes
              (char *addr,char *addr_family,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  bool bVar16;
  uchar decoded [40];
  uint8_t data [84];
  uchar local_118 [48];
  char local_e8 [96];
  byte local_88 [88];
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  if (len == 0) {
    return -2;
  }
  if (bytes_out == (uchar *)0x0) {
    return -2;
  }
  if (addr == (char *)0x0) {
    return -2;
  }
  if (addr_family == (char *)0x0) {
    return -2;
  }
  if (flags != 0) {
    return -2;
  }
  pcVar6 = (char *)strlen(addr);
  bVar3 = true;
  if (pcVar6 + -0x5b < (char *)0xffffffffffffffad) {
    bVar16 = false;
    pcVar14 = addr_family;
  }
  else {
    if (pcVar6 == (char *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar13 = (char *)0x0;
      pcVar7 = addr;
      do {
        pcVar7 = pcVar7 + -1;
        pcVar14 = pcVar13;
        if (pcVar7[(long)pcVar6] == '1') break;
        pcVar13 = pcVar13 + 1;
        pcVar14 = pcVar6;
      } while (pcVar6 != pcVar13);
    }
    pcVar7 = pcVar14 + 1;
    uVar11 = (long)pcVar6 - (long)pcVar7;
    bVar16 = false;
    if ((char *)0x5 < pcVar14 && (pcVar7 <= pcVar6 && uVar11 != 0)) {
      bVar16 = false;
      pcVar14 = pcVar14 + -6;
      lVar12 = uVar11 + (uVar11 == 0);
      bVar3 = false;
      uVar10 = 1;
      lVar8 = 0;
      do {
        lVar15 = lVar8;
        cVar1 = addr[lVar15];
        uVar9 = (uint)cVar1;
        if ((byte)(cVar1 - 0x21U) < 0x5e) {
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar3 = true;
          }
          else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            bVar16 = true;
            uVar9 = uVar9 | 0x20;
          }
          local_e8[lVar15] = (char)uVar9;
          uVar4 = bech32_polymod_step(uVar10);
          uVar10 = uVar9 >> 5 ^ uVar4;
        }
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_00103682;
        lVar8 = lVar15 + 1;
      } while (lVar12 != lVar15 + 1);
      local_e8[lVar15 + 1] = '\0';
      uVar4 = bech32_polymod_step(uVar10);
      pcVar13 = (char *)0x1;
      if (pcVar6 != pcVar7) {
        lVar8 = 0;
        do {
          uVar4 = bech32_polymod_step(uVar4);
          uVar4 = (byte)addr[lVar8] & 0x1f ^ uVar4;
          lVar8 = lVar8 + 1;
        } while (lVar12 != lVar8);
        pcVar13 = (char *)(lVar12 + 1);
      }
      do {
        if (pcVar6 <= pcVar13) {
          if ((!bVar3) || (!bVar16)) {
            bVar16 = uVar4 == 0x2bc830a3;
            bVar3 = uVar4 != 1 && !bVar16;
            goto LAB_00103684;
          }
          break;
        }
        cVar1 = addr[(long)pcVar13];
        if ((long)cVar1 < 0) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = (uint)charset_rev[cVar1];
        }
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar3 = true;
        }
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar16 = true;
        }
        if (uVar10 != 0xffffffff) {
          uVar4 = bech32_polymod_step(uVar4);
          if (pcVar13 + 6 < pcVar6) {
            (local_88 + ~uVar11)[(long)pcVar13] = (byte)uVar10;
          }
          uVar4 = uVar4 ^ uVar10;
          pcVar13 = pcVar13 + 1;
        }
      } while (uVar10 != 0xffffffff);
LAB_00103682:
      bVar16 = false;
      bVar3 = true;
    }
  }
LAB_00103684:
  if (((!bVar3) && ((char *)0xffffffffffffffbe < pcVar14 + -0x42)) &&
     (iVar5 = strncmp(addr_family,local_e8,0x54), iVar5 == 0)) {
    if (local_88[0] == 0) {
      if (!bVar16) goto LAB_0010374b;
    }
    else if (bVar16 && local_88[0] < 0x11) {
LAB_0010374b:
      *written = 0;
      iVar5 = convert_bits(local_118,written,8,(uint8_t *)((long)local_88 + 1),
                           (size_t)(pcVar14 + -1),5,0);
      if (((iVar5 != 0) && (sVar2 = *written, 0xffffffffffffffd8 < sVar2 - 0x29)) &&
         ((bVar3 = false, local_88[0] != 0 || ((sVar2 == 0x14 || (sVar2 == 0x20))))))
      goto LAB_001036d0;
    }
  }
  wally_clear_2(local_88,0x54,local_e8,0x54);
  bVar3 = true;
  local_88[0] = 0;
LAB_001036d0:
  iVar5 = -2;
  if (!bVar3) {
    iVar5 = wally_witness_program_from_bytes_using_version
                      (local_118,*written,local_88[0],0,bytes_out,len,written);
  }
  wally_clear(local_118,0x28);
  return iVar5;
}

Assistant:

int wally_addr_segwit_to_bytes(const char *addr, const char *addr_family,
                               uint32_t flags,
                               unsigned char *bytes_out, size_t len,
                               size_t *written)
{
    int witver = 0;
    unsigned char decoded[40];
    int ret;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    /* Only v0 witness programs are currently allowed */
    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr))
        ret = WALLY_EINVAL;
    else
        ret = wally_witness_program_from_bytes_using_version(
            decoded, *written, witver, flags, bytes_out, len, written);

    wally_clear(decoded, sizeof(decoded));
    return ret;
}